

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZendParser.cpp
# Opt level: O0

void __thiscall
phpconvert::ZendParser::generatePreparedTypesGlobal
          (ZendParser *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tmp)

{
  bool bVar1;
  reference outPrep;
  __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
  local_28;
  __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
  local_20;
  iterator type;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tmp_local;
  ZendParser *this_local;
  
  type._M_current = (PreparedType *)tmp;
  local_20._M_current =
       (PreparedType *)
       std::
       vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
       ::begin(this->typesRegistry);
  while( true ) {
    local_28._M_current =
         (PreparedType *)
         std::
         vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>
         ::end(this->typesRegistry);
    bVar1 = __gnu_cxx::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    outPrep = __gnu_cxx::
              __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
              ::operator*(&local_20);
    generatePreparedTypeFull
              (this,outPrep,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)type._M_current);
    __gnu_cxx::
    __normal_iterator<phpconvert::BaseParser::PreparedType_*,_std::vector<phpconvert::BaseParser::PreparedType,_std::allocator<phpconvert::BaseParser::PreparedType>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void ZendParser::generatePreparedTypesGlobal(vector<string> &tmp) {
        vector<PreparedType>::iterator type = typesRegistry->begin();
        for (; type != typesRegistry->end(); ++type) {
            generatePreparedTypeFull(*type, tmp);
        }
    }